

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O3

void hwnet::TCPConnector::connectTimeout(Ptr *t,Ptr *self)

{
  char cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  Poller *this_00;
  int iVar2;
  _Atomic_word _Var3;
  element_type *peVar4;
  element_type *peVar5;
  bool bVar6;
  Ptr local_28;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)
                             &((self->
                               super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->mtx);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  peVar5 = (self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this = (peVar5->connectTimer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00119c22:
    if ((t->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) goto LAB_00119c6c;
    peVar5 = (self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    cVar1 = peVar5->doing;
  }
  else {
    _Var3 = this->_M_use_count;
    do {
      if (_Var3 == 0) goto LAB_00119c22;
      LOCK();
      iVar2 = this->_M_use_count;
      bVar6 = _Var3 == iVar2;
      if (bVar6) {
        this->_M_use_count = _Var3 + 1;
        iVar2 = _Var3;
      }
      _Var3 = iVar2;
      UNLOCK();
    } while (!bVar6);
    if (this->_M_use_count == 0) {
      peVar4 = (element_type *)0x0;
    }
    else {
      peVar4 = (peVar5->connectTimer).
               super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if ((t->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr != peVar4) {
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      goto LAB_00119c6c;
    }
    peVar5 = (self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    cVar1 = peVar5->doing;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      if ((bool)cVar1 != false) goto LAB_00119c6c;
      peVar5 = (self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      goto LAB_00119c81;
    }
  }
  if (cVar1 == '\0') {
LAB_00119c81:
    std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(peVar5->connectTimer).
                super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
    peVar5 = (self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar5->doing = true;
    peVar5->gotError = true;
    peVar5->err = 0x6e;
    pthread_mutex_unlock((pthread_mutex_t *)&peVar5->mtx);
    local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          super_Task;
    this_00 = ((element_type *)
              local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->poller_;
    local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Poller::PostTask(this_00,&local_28,(ThreadPool *)0x0);
    if (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    return;
  }
LAB_00119c6c:
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             &((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              mtx);
  return;
}

Assistant:

void TCPConnector::connectTimeout(const util::Timer::Ptr &t,TCPConnector::Ptr self) {
	auto post = false;
	self->mtx.lock();
	if(t == self->connectTimer.lock() && !self->doing){
		self->connectTimer.reset();
		self->doing = true;
		post = true;
		self->gotError = true;
		self->err = ETIMEDOUT;
	}
	self->mtx.unlock();
	if(post) {
		self->poller_->PostTask(self);
	}	
}